

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O3

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
::TestBody(ContractTestOnClassWithInvariant_ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange_Test
           *this)

{
  TestClassWithInvariant *this_00;
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int oldY;
  int oldX;
  AssertHelper local_60;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  string local_40;
  int local_20;
  int local_1c;
  
  this_00 = &(this->super_ContractTestOnClassWithInvariant).sut;
  local_1c = (this->super_ContractTestOnClassWithInvariant).sut.x;
  local_20 = (this->super_ContractTestOnClassWithInvariant).sut.y;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    anon_unknown.dwarf_2b38::TestClassWithInvariant::setX(this_00,0);
  }
  testing::Message::Message((Message *)&local_40);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
             ,0x7e,
             "Expected: sut.setX(0) throws an exception of type PreConditionFailedEx.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((long *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p
                                    ) + 8))();
    }
  }
  local_58.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"0","sut.invariantWasCalled",(int *)&local_58,
             &(this->super_ContractTestOnClassWithInvariant).sut.invariantWasCalled);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar1 = (internal)(this->super_ContractTestOnClassWithInvariant).sut.preConditionWasCalled;
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58.data_._0_1_ = iVar1;
  if (iVar1 == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&local_58,(AssertionResult *)"sut.preConditionWasCalled",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x81,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      (char)local_40._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = (this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled == 0;
  local_58.data_._0_4_ = CONCAT31(local_58.data_._1_3_,bVar2);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&local_58,(AssertionResult *)"sut.postConditionWasCalled",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x82,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      (char)local_40._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"oldX","sut.x",&local_1c,&this_00->x);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"oldY","sut.y",&local_20,
             &(this->super_ContractTestOnClassWithInvariant).sut.y);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPreConditionFireTheSetExceptionAndThatTheInvariantWasNotCalledAndThatTheStateOfTheClassDoesNotChange)
{
  auto oldX = sut.x;
  auto oldY = sut.y;
  EXPECT_THROW(sut.setX(0), PreConditionFailedEx);

  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);

  EXPECT_EQ(oldX, sut.x);
  EXPECT_EQ(oldY, sut.y);
}